

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_framebuffer.cpp
# Opt level: O0

bool __thiscall OpenGLFrameBuffer::Begin2D(OpenGLFrameBuffer *this,bool param_1)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  bool param_1_local;
  OpenGLFrameBuffer *this_local;
  
  VSMatrix::loadIdentity(&gl_RenderState.mViewMatrix);
  iVar2 = DCanvas::GetWidth((DCanvas *)this);
  iVar3 = DCanvas::GetHeight((DCanvas *)this);
  VSMatrix::ortho(&gl_RenderState.mProjectionMatrix,0.0,(float)iVar2,(float)iVar3,0.0,-1.0,1.0);
  FRenderState::ApplyMatrices(&gl_RenderState);
  (*_ptrc_glDisable)(0xb71);
  bVar1 = FBoolCVar::operator_cast_to_bool(&gl_aalines);
  if (bVar1) {
    (*_ptrc_glEnable)(0xb20);
  }
  else {
    (*_ptrc_glDisable)(0x809d);
    (*_ptrc_glDisable)(0xb20);
    (*_ptrc_glLineWidth)(1.0);
  }
  if (GLRenderer != (FGLRenderer *)0x0) {
    FGLRenderer::Begin2D(GLRenderer);
  }
  return true;
}

Assistant:

bool OpenGLFrameBuffer::Begin2D(bool)
{
	gl_RenderState.mViewMatrix.loadIdentity();
	gl_RenderState.mProjectionMatrix.ortho(0, GetWidth(), GetHeight(), 0, -1.0f, 1.0f);
	gl_RenderState.ApplyMatrices();

	glDisable(GL_DEPTH_TEST);

	// Korshun: ENABLE AUTOMAP ANTIALIASING!!!
	if (gl_aalines)
		glEnable(GL_LINE_SMOOTH);
	else
	{
		glDisable(GL_MULTISAMPLE);
		glDisable(GL_LINE_SMOOTH);
		glLineWidth(1.0);
	}

	if (GLRenderer != NULL)
			GLRenderer->Begin2D();
	return true;
}